

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_EqualCommonExpr_Test::TestBody(ExprTest_EqualCommonExpr_Test *this)

{
  Expr e1;
  Expr e1_00;
  Expr e1_01;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  long in_RDI;
  char *file;
  AssertionResult *this_00;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  AssertionResult *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar4;
  ExprBase in_stack_fffffffffffffe70;
  AssertionResult *this_01;
  int in_stack_fffffffffffffe7c;
  int line;
  char *in_stack_fffffffffffffe80;
  Type in_stack_fffffffffffffe8c;
  Type type;
  ExprBase in_stack_fffffffffffffe90;
  ExprBase e2;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined7 in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_e8;
  string local_d8 [48];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_a8;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_98;
  AssertionResult local_88;
  string local_78 [64];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_38;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_28;
  AssertionResult local_18;
  
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  e1.super_ExprBase.impl_._7_1_ = in_stack_fffffffffffffe9f;
  e1.super_ExprBase.impl_._0_7_ = in_stack_fffffffffffffe98;
  mp::Equal(e1,(Expr)in_stack_fffffffffffffe90.impl_);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90.impl_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffec0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe90.impl_,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               (char *)in_stack_fffffffffffffe70.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_78);
    testing::Message::~Message((Message *)0x1330bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133136);
  file = (char *)(in_RDI + 0x10);
  type = kSuccess;
  local_98.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_a8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  e1_00.super_ExprBase.impl_._7_1_ = in_stack_fffffffffffffe9f;
  e1_00.super_ExprBase.impl_._0_7_ = in_stack_fffffffffffffe98;
  mp::Equal(e1_00,(Expr)in_stack_fffffffffffffe90.impl_);
  e2.impl_ = (Impl *)&local_88;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  uVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)e2.impl_);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)e2.impl_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffec0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)e2.impl_,type,file,in_stack_fffffffffffffe7c,
               (char *)in_stack_fffffffffffffe70.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x1332bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13333a);
  this_00 = (AssertionResult *)(in_RDI + 0x10);
  uVar4 = 0;
  mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(uVar4,in_stack_fffffffffffffe68),(Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(uVar4,in_stack_fffffffffffffe68),(Reference)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  e1_01.super_ExprBase.impl_._7_1_ = uVar2;
  e1_01.super_ExprBase.impl_._0_7_ = in_stack_fffffffffffffe98;
  mp::Equal(e1_01,(Expr)e2.impl_);
  this_01 = &local_e8;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_fffffffffffffe5f);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe7c);
  if (!bVar3) {
    testing::Message::Message((Message *)e2.impl_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffec0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)e2.impl_,type,file,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
    testing::Message::~Message((Message *)0x1334b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13352e);
  return;
}

Assistant:

TEST_F(ExprTest, EqualCommonExpr) {
  EXPECT_TRUE(Equal(factory_.MakeCommonExpr(0), factory_.MakeCommonExpr(0)));
  EXPECT_FALSE(Equal(factory_.MakeCommonExpr(0), factory_.MakeCommonExpr(1)));
  EXPECT_FALSE(Equal(factory_.MakeCommonExpr(0), factory_.MakeVariable(0)));
}